

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O2

void __thiscall priority_deque_iterator::test_method(priority_deque_iterator *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  value_expr<bool> local_165;
  int local_164;
  char *local_160;
  char *local_158;
  int pushed;
  undefined4 uStack_14c;
  undefined1 local_148;
  shared_count local_140;
  char **local_138;
  undefined1 local_130 [24];
  multiset<int,_std::less<int>,_std::allocator<int>_> existing_elements;
  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> pd;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  for (iVar2 = 1; iVar2 != 8; iVar2 = iVar2 + 1) {
    pd.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pd.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pd.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_70.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_70.m_end = "";
    local_80.m_begin = "";
    local_80.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11d,&local_80);
    local_160 = (char *)CONCAT71(local_160._1_7_,
                                 pd.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start ==
                                 pd.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish);
    local_164 = iVar2;
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)&pushed,(value_expr<bool> *)&local_160,false);
    local_130._0_8_ = "(pd.begin() == pd.end())";
    local_130._8_8_ = "";
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
    existing_elements._M_t._M_impl._0_8_ = &PTR__lazy_ostream_001d8cd0;
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_130;
    local_90.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_90.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&pushed,(lazy_ostream *)&existing_elements,&local_90,0x11d,
               REQUIRE,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_140);
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &existing_elements._M_t._M_impl.super__Rb_tree_header._M_header;
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar2 = local_164;
    existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         existing_elements._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      iVar1 = rand();
      _pushed = (undefined **)CONCAT44(uStack_14c,iVar1);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_equal<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &existing_elements,&pushed);
      boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
      ::push(&pd,(value_type *)&pushed);
    }
    local_a0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_a0.m_end = "";
    local_b0.m_begin = "";
    local_b0.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x127,&local_b0);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_60,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &existing_elements);
    iVar2 = local_164;
    local_165.m_value =
         (anonymous_namespace)::
         have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
                   (&pd,(multiset<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)local_130,&local_165,false);
    local_160 = "have_same_elements(pd, existing_elements)";
    local_158 = "";
    local_148 = 0;
    _pushed = &PTR__lazy_ostream_001d8cd0;
    local_140.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_138 = &local_160;
    local_c0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_c0.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)&pushed,&local_c0,0x127,REQUIRE,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(local_130 + 0x10));
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &existing_elements);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&pd);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( priority_deque_iterator )
{
  using namespace boost::container;
  for (int push_count = 1; push_count < 8; ++push_count)
  {
    priority_deque<int> pd;
    BOOST_TEST_REQUIRE((pd.begin() == pd.end()));

    std::multiset<int> existing_elements;
    for (int i = 0; i < push_count; ++i)
    {
      int pushed = rand();
      existing_elements.insert(pushed);
      pd.push(pushed);
    }

    BOOST_TEST_REQUIRE(have_same_elements(pd, existing_elements));
  }
}